

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

qint64 __thiscall QHttpPartPrivate::size(QHttpPartPrivate *this)

{
  qsizetype qVar1;
  long in_RDI;
  QHttpPartPrivate *unaff_retaddr;
  qint64 size;
  undefined8 local_10;
  
  checkHeaderCreated(unaff_retaddr);
  qVar1 = QByteArray::size((QByteArray *)(in_RDI + 0x70));
  if (*(long *)(in_RDI + 0x68) == 0) {
    local_10 = QByteArray::size((QByteArray *)(in_RDI + 0x50));
  }
  else {
    local_10 = (**(code **)(**(long **)(in_RDI + 0x68) + 0x80))();
  }
  local_10 = local_10 + qVar1;
  return local_10;
}

Assistant:

qint64 QHttpPartPrivate::size() const
{
    checkHeaderCreated();
    qint64 size = header.size();
    if (bodyDevice) {
        size += bodyDevice->size();
    } else {
        size += body.size();
    }
    return size;
}